

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand.h
# Opt level: O1

string * __thiscall hand::printHand_abi_cxx11_(string *__return_storage_ptr__,hand *this)

{
  pointer pcVar1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  pointer pcVar5;
  long *local_98;
  long local_88;
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar5 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar5 != pcVar1) {
    do {
      local_50[0] = local_40;
      pcVar2 = (pcVar5->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar2,pcVar2 + (pcVar5->name)._M_string_length);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x108149);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*plVar3;
      }
      local_68 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_88 = *plVar4;
        lStack_80 = plVar3[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar4;
        local_98 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string hand::printHand() {
    string output;
    for (auto &card : hand_) output += "[" + card.getName() + "] ";
    return output;
}